

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure746.c
# Opt level: O2

void test_write_disk_secure746b(void)

{
  int iVar1;
  archive *_a;
  archive_entry *paVar2;
  la_ssize_t v2;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                  ,L'Y',L'\x12');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                     ,L'\\',"target",L'ǀ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L']',"target/foo",L'ǀ',L'\xffffffff',"unmodified");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                     ,L'`',"sandbox",L'ǀ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                  ,L'a',"sandbox");
  _a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                   ,L'd',(uint)(_a != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(_a,L'Ā');
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                   ,L'h',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"symlink");
  archive_entry_set_mode(paVar2,0xa1ff);
  archive_entry_copy_symlink(paVar2,"../target");
  iVar1 = archive_write_header(_a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L'l',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                   ,L'p',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"bar");
  archive_entry_set_mode(paVar2,0x81ff);
  archive_entry_set_size(paVar2,8);
  archive_entry_copy_hardlink(paVar2,"symlink/foo");
  iVar1 = archive_write_header(_a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L'u',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",_a);
  v2 = archive_write_data(_a,"modified",8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L'v',-0x1e,"ARCHIVE_FATAL",v2,"archive_write_data(a, \"modified\", 8)",_a);
  archive_entry_free(paVar2);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
             ,L'z',"unmodified","../target/foo");
  iVar1 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L'|',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_write_close(a)",_a);
  archive_write_free(_a);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure746b)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk security checks not supported on Windows");
#else
	struct archive *a;
	struct archive_entry *ae;

	/* Start with a known umask. */
	assertUmask(UMASK);

	/* The target directory we're going to try to affect. */
	assertMakeDir("target", 0700);
	assertMakeFile("target/foo", 0700, "unmodified");

	/* The sandbox dir we're going to work within. */
	assertMakeDir("sandbox", 0700);
	assertChdir("sandbox");

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);

	/* Create a symlink to the target directory. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "symlink");
	archive_entry_set_mode(ae, AE_IFLNK | 0777);
	archive_entry_copy_symlink(ae, "../target");
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Attempt to hardlink to the target directory via the symlink. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "bar");
	archive_entry_set_mode(ae, AE_IFREG | 0777);
	archive_entry_set_size(ae, 8);
	archive_entry_copy_hardlink(ae, "symlink/foo");
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	assertEqualIntA(a, ARCHIVE_FATAL, archive_write_data(a, "modified", 8));
	archive_entry_free(ae);

	/* Verify that target file contents are unchanged. */
	assertTextFileContents("unmodified", "../target/foo");

	assertEqualIntA(a, ARCHIVE_FATAL, archive_write_close(a));
	archive_write_free(a);
#endif
}